

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  int iVar1;
  int iVar2;
  int ii_1;
  char *z_1;
  int ii;
  char *z;
  i64 iVal;
  int eType;
  int eDetail;
  Fts5VocabCursor *pCsr;
  int iCol_local;
  sqlite3_context *pCtx_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  iVar1 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xColumn + 4);
  iVar2 = pCursor->pVtab[2].nRef;
  z = (char *)0x0;
  if (iCol == 0) {
    sqlite3_result_text(pCtx,(char *)pCursor[0xb].pVtab,*(int *)&pCursor[0xc].pVtab,
                        (_func_void_void_ptr *)0xffffffffffffffff);
  }
  else if (iVar2 == 0) {
    if (iCol == 1) {
      if (iVar1 != 1) {
        sqlite3_result_text(pCtx,*(char **)((pCursor[2].pVtab[1].pModule)->xDisconnect +
                                           (long)*(int *)&pCursor[7].pVtab * 8),-1,
                            (_func_void_void_ptr *)0x0);
      }
    }
    else if (iCol == 2) {
      z = (char *)(&(pCursor[9].pVtab)->pModule)[*(int *)&pCursor[7].pVtab];
    }
    else {
      z = (char *)(&(pCursor[8].pVtab)->pModule)[*(int *)&pCursor[7].pVtab];
    }
  }
  else if (iVar2 == 1) {
    if (iCol == 1) {
      z = (char *)(pCursor[9].pVtab)->pModule;
    }
    else {
      z = (char *)(pCursor[8].pVtab)->pModule;
    }
  }
  else if (iCol == 1) {
    sqlite3_result_int64(pCtx,(i64)(pCursor[4].pVtab)->pModule);
  }
  else if (iCol == 2) {
    z_1._4_4_ = -1;
    if (iVar1 == 0) {
      z_1._4_4_ = (int)((ulong)pCursor[0xd].pVtab >> 0x20);
    }
    else if (iVar1 == 2) {
      z_1._4_4_ = (int)pCursor[0xd].pVtab;
    }
    if ((-1 < z_1._4_4_) && (z_1._4_4_ < *(int *)&(pCursor[2].pVtab[1].pModule)->xBestIndex)) {
      sqlite3_result_text(pCtx,*(char **)((pCursor[2].pVtab[1].pModule)->xDisconnect +
                                         (long)z_1._4_4_ * 8),-1,(_func_void_void_ptr *)0x0);
    }
  }
  else if (iVar1 == 0) {
    sqlite3_result_int(pCtx,(uint)pCursor[0xd].pVtab & 0x7fffffff);
  }
  if (0 < (long)z) {
    sqlite3_result_int64(pCtx,(i64)z);
  }
  return 0;
}

Assistant:

static int fts5VocabColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  int eDetail = pCsr->pFts5->pConfig->eDetail;
  int eType = ((Fts5VocabTable*)(pCursor->pVtab))->eType;
  i64 iVal = 0;

  if( iCol==0 ){
    sqlite3_result_text(
        pCtx, (const char*)pCsr->term.p, pCsr->term.n, SQLITE_TRANSIENT
    );
  }else if( eType==FTS5_VOCAB_COL ){
    assert( iCol==1 || iCol==2 || iCol==3 );
    if( iCol==1 ){
      if( eDetail!=FTS5_DETAIL_NONE ){
        const char *z = pCsr->pFts5->pConfig->azCol[pCsr->iCol];
        sqlite3_result_text(pCtx, z, -1, SQLITE_STATIC);
      }
    }else if( iCol==2 ){
      iVal = pCsr->aDoc[pCsr->iCol];
    }else{
      iVal = pCsr->aCnt[pCsr->iCol];
    }
  }else if( eType==FTS5_VOCAB_ROW ){
    assert( iCol==1 || iCol==2 );
    if( iCol==1 ){
      iVal = pCsr->aDoc[0];
    }else{
      iVal = pCsr->aCnt[0];
    }
  }else{
    assert( eType==FTS5_VOCAB_INSTANCE );
    switch( iCol ){
      case 1:
        sqlite3_result_int64(pCtx, pCsr->pIter->iRowid);
        break;
      case 2: {
        int ii = -1;
        if( eDetail==FTS5_DETAIL_FULL ){
          ii = FTS5_POS2COLUMN(pCsr->iInstPos);
        }else if( eDetail==FTS5_DETAIL_COLUMNS ){
          ii = (int)pCsr->iInstPos;
        }
        if( ii>=0 && ii<pCsr->pFts5->pConfig->nCol ){
          const char *z = pCsr->pFts5->pConfig->azCol[ii];
          sqlite3_result_text(pCtx, z, -1, SQLITE_STATIC);
        }
        break;
      }
      default: {
        assert( iCol==3 );
        if( eDetail==FTS5_DETAIL_FULL ){
          int ii = FTS5_POS2OFFSET(pCsr->iInstPos);
          sqlite3_result_int(pCtx, ii);
        }
        break;
      }
    }
  }

  if( iVal>0 ) sqlite3_result_int64(pCtx, iVal);
  return SQLITE_OK;
}